

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::equals(ReorderingBuffer *this,uint8_t *otherStart,uint8_t *otherLimit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint local_40;
  uint local_3c;
  UChar32 other;
  UChar32 c;
  int32_t j;
  int32_t i;
  int32_t otherLength;
  int32_t length;
  uint8_t *otherLimit_local;
  uint8_t *otherStart_local;
  ReorderingBuffer *this_local;
  
  iVar1 = (int)((long)this->limit - (long)this->start >> 1);
  iVar2 = (int)otherLimit - (int)otherStart;
  if ((iVar1 <= iVar2) && (iVar2 / 3 <= iVar1)) {
    c = 0;
    other = 0;
    do {
      if (iVar1 <= c) {
        return iVar2 <= other;
      }
      if (iVar2 <= other) {
        return '\0';
      }
      local_3c = (uint)(ushort)this->start[c];
      iVar3 = c + 1;
      if ((local_3c & 0xfffffc00) == 0xd800) {
        local_3c = local_3c * 0x400 + (uint)(ushort)this->start[c + 1] + 0xfca02400;
        iVar3 = c + 2;
      }
      c = iVar3;
      iVar3 = other + 1;
      local_40 = (uint)otherStart[other];
      if ((otherStart[other] & 0x80) != 0) {
        if (local_40 < 0xe0) {
          local_40 = (local_40 & 0x1f) << 6 | otherStart[iVar3] & 0x3f;
          iVar3 = other + 2;
        }
        else if (local_40 < 0xf0) {
          local_40 = (local_40 & 0xf) << 0xc | (otherStart[iVar3] & 0x3f) << 6 |
                     otherStart[other + 2] & 0x3f;
          iVar3 = other + 3;
        }
        else {
          local_40 = (local_40 & 7) << 0x12 | (otherStart[iVar3] & 0x3f) << 0xc |
                     (otherStart[other + 2] & 0x3f) << 6 | otherStart[other + 3] & 0x3f;
          iVar3 = other + 4;
        }
      }
      other = iVar3;
    } while (local_3c == local_40);
  }
  return '\0';
}

Assistant:

UBool ReorderingBuffer::equals(const uint8_t *otherStart, const uint8_t *otherLimit) const {
    U_ASSERT((otherLimit - otherStart) <= INT32_MAX);  // ensured by caller
    int32_t length = (int32_t)(limit - start);
    int32_t otherLength = (int32_t)(otherLimit - otherStart);
    // For equal strings, UTF-8 is at least as long as UTF-16, and at most three times as long.
    if (otherLength < length || (otherLength / 3) > length) {
        return FALSE;
    }
    // Compare valid strings from between normalization boundaries.
    // (Invalid sequences are normalization-inert.)
    for (int32_t i = 0, j = 0;;) {
        if (i >= length) {
            return j >= otherLength;
        } else if (j >= otherLength) {
            return FALSE;
        }
        // Not at the end of either string yet.
        UChar32 c, other;
        U16_NEXT_UNSAFE(start, i, c);
        U8_NEXT_UNSAFE(otherStart, j, other);
        if (c != other) {
            return FALSE;
        }
    }
}